

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Singleton.cpp
# Opt level: O0

Singleton * Singleton::Lookup(char *name)

{
  byte bVar1;
  ostream *this;
  char *pcVar2;
  Singleton *pSVar3;
  undefined1 auVar4 [16];
  undefined1 local_30 [8];
  NameSingletonPair pair;
  Iterator<NameSingletonPair> *i;
  char *name_local;
  
  this = std::operator<<((ostream *)&std::cout,"Singleton::Lookup(const char*)");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  pair._singleton = (Singleton *)List<NameSingletonPair>::CreateIterator(_registry);
  (***(_func_int ***)pair._singleton)();
  while( true ) {
    bVar1 = (**(code **)(*(long *)pair._singleton + 0x10))();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      return (Singleton *)0x0;
    }
    auVar4 = (**(code **)(*(long *)pair._singleton + 0x18))();
    pair._name = auVar4._8_8_;
    local_30 = auVar4._0_8_;
    pcVar2 = NameSingletonPair::GetName((NameSingletonPair *)local_30);
    if (pcVar2 == name) break;
    (**(code **)(*(long *)pair._singleton + 8))();
  }
  pSVar3 = NameSingletonPair::GetSingleton((NameSingletonPair *)local_30);
  return pSVar3;
}

Assistant:

Singleton* Singleton::Lookup(const char* name)
{

    std::cout << "Singleton::Lookup(const char*)" << std::endl;

    Iterator<NameSingletonPair>* i = _registry->CreateIterator();
    for (i->First(); !i->IsDone(); i->Next()) {
        NameSingletonPair pair = i->CurrentItem();
        if (pair.GetName() == name) {
            return pair.GetSingleton();
        }
    }
    return 0;
}